

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_characters.h
# Opt level: O3

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,3ul>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               characters_t<char,_3UL> *fmt)

{
  ulong uVar1;
  
  if ((fmt->value).m_length != 0) {
    uVar1 = 0;
    do {
      if ((end->m_position == pos->m_position) ||
         (pos->m_cache[pos->m_position] != (fmt->value).m_data._M_elems[uVar1])) {
        return false;
      }
      uVar1 = uVar1 + 1;
      iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
    } while (uVar1 < (fmt->value).m_length);
  }
  return true;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, const characters_t<Char, Length>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    for (std::size_t i = 0; i < fmt.value.length(); ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        if (ch != fmt.value[i])
            return false;
    }

    return read_impl(pos, end, std::forward<Others>(others)...);
}